

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

string * __thiscall
program_options::invalid_syntax::get_template_abi_cxx11_(invalid_syntax *this,kind_t kind)

{
  undefined4 in_EDX;
  string *in_RDI;
  char *msg;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  char *this_00;
  
  switch(in_EDX) {
  case 0x1e:
    this_00 = "the unabbreviated option \'%canonical_option%\' is not valid";
    break;
  case 0x1f:
    this_00 = "the unabbreviated option \'%canonical_option%\' does not take any arguments";
    break;
  case 0x20:
    this_00 = "the abbreviated option \'%canonical_option%\' does not take any arguments";
    break;
  case 0x21:
    this_00 = 
    "the argument for option \'%canonical_option%\' should follow immediately after the equal sign";
    break;
  case 0x22:
    this_00 = "the required argument for option \'%canonical_option%\' is missing";
    break;
  case 0x23:
    this_00 = "option \'%canonical_option%\' does not take any arguments";
    break;
  case 0x24:
    this_00 = "the options configuration file contains an invalid line \'%invalid_line%\'";
    break;
  default:
    this_00 = "unknown command line syntax error for \'%s\'";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdf);
  return in_RDI;
}

Assistant:

std::string invalid_syntax::get_template(kind_t kind)
{
    // Initially, store the message in 'const char*' variable,
    // to avoid conversion to string in all cases.
    const char* msg;
    switch(kind)
    {
    case empty_adjacent_parameter:
        msg = "the argument for option '%canonical_option%' should follow immediately after the equal sign";
        break;
    case missing_parameter:
        msg = "the required argument for option '%canonical_option%' is missing";
        break;
    case unrecognized_line:
        msg = "the options configuration file contains an invalid line '%invalid_line%'";
        break;
    // none of the following are currently used:
    case long_not_allowed:
        msg = "the unabbreviated option '%canonical_option%' is not valid";
        break;
    case long_adjacent_not_allowed:
        msg = "the unabbreviated option '%canonical_option%' does not take any arguments";
        break;
    case short_adjacent_not_allowed:
        msg = "the abbreviated option '%canonical_option%' does not take any arguments";
        break;
    case extra_parameter:
        msg = "option '%canonical_option%' does not take any arguments";
        break;
    default:
        msg = "unknown command line syntax error for '%s'";
    }
    return msg;
}